

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
curi_url_decode(char *input,size_t inputLen,char *output,size_t outputCapacity,size_t *outputLen)

{
  ushort *puVar1;
  size_t sVar2;
  curi_status cVar3;
  int iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  uint local_80;
  int local_70;
  curi_status __TRY_tryStatus_1;
  size_t __TRY_initialOffset_1;
  int encodedChar;
  curi_status __TRY_tryStatus;
  size_t __TRY_initialOffset;
  size_t outputOffset;
  size_t inputOffset;
  size_t *psStack_38;
  curi_status status;
  size_t *outputLen_local;
  size_t outputCapacity_local;
  char *output_local;
  size_t inputLen_local;
  char *input_local;
  
  inputOffset._4_4_ = curi_status_error;
  outputOffset = 0;
  __TRY_initialOffset = 0;
  psStack_38 = outputLen;
  outputLen_local = (size_t *)outputCapacity;
  outputCapacity_local = (size_t)output;
  output_local = (char *)inputLen;
  inputLen_local = (size_t)input;
  while( true ) {
    do {
      sVar2 = outputOffset;
      if (outputLen_local <= __TRY_initialOffset) {
        pcVar6 = read_char((char *)inputLen_local,(size_t)output_local,&outputOffset);
        if (*pcVar6 == '\0') {
          if (psStack_38 != (size_t *)0x0) {
            *psStack_38 = __TRY_initialOffset;
          }
          input_local._4_4_ = curi_status_success;
        }
        else {
          input_local._4_4_ = curi_status_error;
        }
        return input_local._4_4_;
      }
      inputOffset._4_4_ = curi_status_error;
      cVar3 = parse_percent_encoded
                        ((char *)inputLen_local,(size_t)output_local,&outputOffset,
                         (curi_settings *)0x0,(void *)0x0);
      if (cVar3 == curi_status_error) {
        outputOffset = sVar2;
        cVar3 = inputOffset._4_4_;
      }
      inputOffset._4_4_ = cVar3;
      if (inputOffset._4_4_ == curi_status_success) {
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[(int)*(char *)(inputLen_local + (outputOffset - 2))] & 0x800) == 0) {
          local_70 = tolower((int)*(char *)(inputLen_local + (outputOffset - 2)));
          local_70 = local_70 + -0x57;
        }
        else {
          local_70 = *(char *)(inputLen_local + (outputOffset - 2)) + -0x30;
        }
        ppuVar5 = __ctype_b_loc();
        puVar1 = *ppuVar5;
        iVar4 = tolower((int)*(char *)(inputLen_local + (outputOffset - 1)));
        if ((puVar1[iVar4] & 0x800) == 0) {
          iVar4 = tolower((int)*(char *)(inputLen_local + (outputOffset - 1)));
          iVar4 = tolower(iVar4);
          local_80 = iVar4 - 0x57;
        }
        else {
          iVar4 = tolower((int)*(char *)(inputLen_local + (outputOffset - 1)));
          local_80 = iVar4 - 0x30;
        }
        local_80 = local_70 << 4 | local_80;
        if ((int)local_80 < 0x80) {
          *(char *)(outputCapacity_local + __TRY_initialOffset) = (char)local_80;
          __TRY_initialOffset = __TRY_initialOffset + 1;
        }
        else {
          inputOffset._4_4_ = curi_status_error;
        }
      }
      sVar2 = outputOffset;
      if (inputOffset._4_4_ == curi_status_error) {
        cVar3 = parse_char('+',(char *)inputLen_local,(size_t)output_local,&outputOffset,
                           (curi_settings *)0x0,(void *)0x0);
        if (cVar3 == curi_status_error) {
          outputOffset = sVar2;
          cVar3 = inputOffset._4_4_;
        }
        inputOffset._4_4_ = cVar3;
        if (inputOffset._4_4_ == curi_status_success) {
          *(undefined1 *)(outputCapacity_local + __TRY_initialOffset) = 0x20;
          __TRY_initialOffset = __TRY_initialOffset + 1;
        }
      }
    } while (inputOffset._4_4_ != curi_status_error);
    pcVar6 = read_char((char *)inputLen_local,(size_t)output_local,&outputOffset);
    *(char *)(outputCapacity_local + __TRY_initialOffset) = *pcVar6;
    if (*(char *)(outputCapacity_local + __TRY_initialOffset) == '\0') break;
    __TRY_initialOffset = __TRY_initialOffset + 1;
  }
  if (psStack_38 != (size_t *)0x0) {
    *psStack_38 = __TRY_initialOffset;
  }
  return curi_status_success;
}

Assistant:

curi_status curi_url_decode(const char* input, size_t inputLen, char* output, size_t outputCapacity, size_t* outputLen /*=0*/)
{
    curi_status status = curi_status_error;
    size_t inputOffset = 0;
    size_t outputOffset = 0;

    #define HEXTOI(x) (isdigit(x) ? x - '0' : tolower(x) - 'a' + 10)

    while ( outputOffset < outputCapacity )
    {
        status = curi_status_error;
        if (status == curi_status_error)
        {
            // percent encoding
            TRY(status, &inputOffset, parse_percent_encoded(input, inputLen, &inputOffset, 0, 0));

            if (status == curi_status_success)
            {
                int encodedChar = ((HEXTOI(input[inputOffset - 2]) << 4) | HEXTOI(tolower(input[inputOffset - 1])));
                if (encodedChar < 128) // Only support ascii percent encodage at the moment.
                {
                    output[outputOffset] = (char)encodedChar;
                    ++outputOffset;
                }
                else
                {
                    status = curi_status_error;
                }
            }
        }

        if (status == curi_status_error)
        {
            // '+' as a space
            TRY(status, &inputOffset, parse_char('+', input, inputLen, &inputOffset, 0, 0));
            if (status == curi_status_success)
            {
                 output[outputOffset] = ' ';
                 ++outputOffset;
            }
        }

        if (status == curi_status_error)
        {
            // "any" character
            output[outputOffset] = *read_char(input, inputLen, &inputOffset);
            if (output[outputOffset] == '\0')
            {
                if (outputLen)
                    *outputLen = outputOffset;

                return curi_status_success;
            }
            else
            {
                ++outputOffset;
            }
        }
    }

    if (*read_char(input, inputLen, &inputOffset) == '\0')
    {
        if (outputLen)
            *outputLen = outputOffset;

        return curi_status_success;
    }
    else
    {
        return curi_status_error;
    }
}